

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reload-archive-6-49.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  Issues issues;
  Issues *in_stack_00000268;
  char *in_stack_00000270;
  Issues *in_stack_00000430;
  char *in_stack_00000438;
  undefined4 in_stack_ffffffffffffffd4;
  int local_4;
  
  std::vector<Data649::Issue,_std::allocator<Data649::Issue>_>::vector
            ((vector<Data649::Issue,_std::allocator<Data649::Issue>_> *)0x1039fb);
  bVar1 = Data649::loadArchive(in_stack_00000438,in_stack_00000430);
  if (bVar1) {
    bVar1 = Data649::saveArchive(in_stack_00000270,in_stack_00000268);
    if (bVar1) {
      local_4 = 0;
    }
    else {
      fprintf(_stderr,"Failed to save archive data\n");
      local_4 = -2;
    }
  }
  else {
    fprintf(_stderr,"Failed to read archive data\n");
    local_4 = -1;
  }
  std::vector<Data649::Issue,_std::allocator<Data649::Issue>_>::~vector
            ((vector<Data649::Issue,_std::allocator<Data649::Issue>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,1));
  return local_4;
}

Assistant:

int main() {
    Data649::Issues issues;

    if (loadArchive(PATH_ARCHIVE_6_49, issues) == false) {
        fprintf(stderr, "Failed to read archive data\n");
        return -1;
    }

    if (saveArchive(PATH_ARCHIVE_6_49, issues) == false) {
        fprintf(stderr, "Failed to save archive data\n");
        return -2;
    }

    return 0;
}